

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssutil.cpp
# Opt level: O0

char * strtoupper(char *str)

{
  int iVar1;
  char *local_18;
  char *p;
  char *str_local;
  
  iVar1 = toupper((int)*str);
  *str = (char)iVar1;
  for (local_18 = str; *local_18 != '\0'; local_18 = local_18 + 1) {
  }
  return str;
}

Assistant:

char* strtoupper(char* str)
{
    char* p = str;

    *p = toupper(*p);
    while (*p)
        p++;

    return str;
}